

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

bool testing::Mock::VerifyAndClear(void *mock_obj)

{
  bool bVar1;
  MutexLock l;
  void *in_stack_ffffffffffffffe8;
  GTestMutexLock local_10;
  
  local_10.mutex_ = (MutexBase *)internal::g_gmock_mutex;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  ClearDefaultActionsLocked((void *)0x11caad);
  bVar1 = VerifyAndClearExpectationsLocked(in_stack_ffffffffffffffe8);
  internal::GTestMutexLock::~GTestMutexLock(&local_10);
  return bVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  ClearDefaultActionsLocked(mock_obj);
  return VerifyAndClearExpectationsLocked(mock_obj);
}